

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O0

size_t __thiscall
helics::ActionMessage::depacketize(ActionMessage *this,void *data,size_t buffer_size)

{
  bool bVar1;
  ulong in_RDX;
  char *in_RSI;
  size_t in_stack_00000010;
  byte *in_stack_00000018;
  ActionMessage *in_stack_00000020;
  size_t bytesUsed;
  uint message_size;
  byte *bytes;
  ActionMessage *in_stack_00000238;
  string_view in_stack_00000240;
  uint local_5c;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  size_t local_40;
  uint local_34;
  char *local_30;
  ulong local_10;
  byte local_1;
  
  if (*in_RSI == -0xd) {
    if (in_RDX < 6) {
      local_10 = 0;
    }
    else {
      local_1 = in_RSI[1];
      local_34 = (uint)(byte)in_RSI[3] + ((uint)(byte)in_RSI[2] + (uint)local_1 * 0x100) * 0x100;
      if (in_RDX < (ulong)local_34 + 2) {
        local_10 = 0;
      }
      else if (in_RSI[local_34] == -6) {
        if (in_RSI[local_34 + 1] == -4) {
          local_30 = in_RSI;
          local_40 = fromByteArray(in_stack_00000020,in_stack_00000018,in_stack_00000010);
          if (local_40 == 0) {
            CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_50,local_30 + 4,(ulong)(local_34 - 4));
            bVar1 = from_json_string(in_stack_00000238,in_stack_00000240);
            if (bVar1) {
              local_40 = (ulong)local_34 + 4;
            }
          }
          if (local_40 == 0) {
            local_5c = 0;
          }
          else {
            local_5c = local_34 + 2;
          }
          local_10 = (ulong)local_5c;
        }
        else {
          local_10 = 0;
        }
      }
      else {
        local_10 = 0;
      }
    }
  }
  else {
    local_10 = 0;
  }
  return local_10;
}

Assistant:

std::size_t ActionMessage::depacketize(const void* data, std::size_t buffer_size)
{
    const auto* bytes = reinterpret_cast<const std::byte*>(data);
    if (bytes[0] != static_cast<std::byte>(LEADING_CHAR)) {
        return 0;
    }
    if (buffer_size < 6) {
        return 0;
    }
    unsigned int message_size = std::to_integer<unsigned char>(bytes[1]);
    message_size <<= 8U;
    message_size += static_cast<unsigned char>(bytes[2]);
    message_size <<= 8U;
    message_size += static_cast<unsigned char>(bytes[3]);
    if (buffer_size < (static_cast<size_t>(message_size) + 2)) {
        return 0;
    }
    if (bytes[message_size] != static_cast<std::byte>(TAIL_CHAR1)) {
        return 0;
    }
    if (bytes[message_size + 1] != static_cast<std::byte>(TAIL_CHAR2)) {
        return 0;
    }

    std::size_t bytesUsed = fromByteArray(bytes + 4, message_size - 4);
    if (bytesUsed == 0U) {
        if (from_json_string(
                std::string_view(reinterpret_cast<const char*>(bytes) + 4, message_size - 4))) {
            bytesUsed = static_cast<std::size_t>(message_size) + 4;
        }
    }
    return (bytesUsed > 0) ? message_size + 2 : 0;
}